

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O3

void __thiscall cmCursesMainForm::RemoveEntry(cmCursesMainForm *this,char *value)

{
  cmake *this_00;
  vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_> *pvVar1;
  pointer __dest;
  int iVar2;
  char *__s2;
  size_t sVar3;
  pointer ppcVar4;
  pointer __src;
  string local_50;
  
  if ((value != (char *)0x0) &&
     (ppcVar4 = (this->Entries->
                super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                )._M_impl.super__Vector_impl_data._M_start, __dest = ppcVar4,
     ppcVar4 !=
     (this->Entries->
     super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
     )._M_impl.super__Vector_impl_data._M_finish)) {
    do {
      __src = __dest + 1;
      __s2 = cmCursesCacheEntryComposite::GetValue(*ppcVar4);
      if ((__s2 != (char *)0x0) && (iVar2 = strcmp(value,__s2), iVar2 == 0)) {
        this_00 = this->CMakeInstance;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        sVar3 = strlen(value);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,value,value + sVar3);
        cmake::UnwatchUnusedCli(this_00,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        pvVar1 = this->Entries;
        ppcVar4 = (pvVar1->
                  super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        if (__src != ppcVar4) {
          memmove(__dest,__src,(long)ppcVar4 - (long)__src);
          ppcVar4 = (pvVar1->
                    super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        }
        (pvVar1->
        super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
        )._M_impl.super__Vector_impl_data._M_finish = ppcVar4 + -1;
        return;
      }
      ppcVar4 = ppcVar4 + 1;
      __dest = __src;
    } while (ppcVar4 !=
             (this->Entries->
             super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void cmCursesMainForm::RemoveEntry(const char* value)
{
  if (!value)
    {
    return;
    }

  std::vector<cmCursesCacheEntryComposite*>::iterator it;
  for (it = this->Entries->begin(); it != this->Entries->end(); ++it)
    {
    const char* val = (*it)->GetValue();
    if (  val && !strcmp(value, val) )
      {
      this->CMakeInstance->UnwatchUnusedCli(value);
      this->Entries->erase(it);
      break;
      }
    }
}